

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

Recycler * __thiscall Memory::Recycler::TrackAllocInfo(Recycler *this,TrackAllocData *data)

{
  code *pcVar1;
  type_info *ptVar2;
  size_t sVar3;
  char *pcVar4;
  undefined4 uVar5;
  bool bVar6;
  undefined4 *puVar7;
  
  if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
    if ((((this->nextAllocData).typeinfo != (type_info *)0x0) ||
        ((this->nextAllocData).plusSize != 0)) || ((this->nextAllocData).count != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1fb1,"(nextAllocData.IsEmpty())","nextAllocData.IsEmpty()");
      if (!bVar6) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    uVar5 = *(undefined4 *)&data->field_0x24;
    (this->nextAllocData).line = data->line;
    *(undefined4 *)&(this->nextAllocData).field_0x24 = uVar5;
    ptVar2 = data->typeinfo;
    sVar3 = data->plusSize;
    pcVar4 = data->filename;
    (this->nextAllocData).count = data->count;
    (this->nextAllocData).filename = pcVar4;
    (this->nextAllocData).typeinfo = ptVar2;
    (this->nextAllocData).plusSize = sVar3;
  }
  return this;
}

Assistant:

Recycler *
Recycler::TrackAllocInfo(TrackAllocData const& data)
{
#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        Assert(nextAllocData.IsEmpty());
        nextAllocData = data;
    }
#endif
    return this;
}